

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpproxy.cpp
# Opt level: O3

void __thiscall httpproxy::~httpproxy(httpproxy *this)

{
  ~httpproxy(this);
  operator_delete(this);
  return;
}

Assistant:

httpproxy::~httpproxy()
{
    clientfds.clear();
    if (events)
    {
        delete[] events;
        events = NULL;
    }
    if (cfg)
    {
        delete[] cfg;
        cfg = NULL;
    }
}